

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioStream.c
# Opt level: O1

UINT8 AudioDrv_DataForward_Remove(void *drvStruct,void *destDrvStruct)

{
  long *plVar1;
  long *plVar2;
  UINT8 UVar3;
  long *__ptr;
  
  if (destDrvStruct == (void *)0x0) {
    UVar3 = 0xff;
  }
  else {
    OSMutex_Lock(*(OS_MUTEX **)((long)drvStruct + 0x40));
    __ptr = *(long **)((long)drvStruct + 0x38);
    if ((__ptr == (long *)0x0) || ((void *)*__ptr == destDrvStruct)) {
      plVar1 = (long *)0x0;
    }
    else {
      do {
        plVar1 = __ptr;
        __ptr = (long *)plVar1[1];
        if (__ptr == (long *)0x0) break;
      } while ((void *)*__ptr != destDrvStruct);
    }
    if (__ptr == (long *)0x0) {
      UVar3 = 0xff;
    }
    else {
      plVar2 = plVar1 + 1;
      if (plVar1 == (long *)0x0) {
        plVar2 = (long *)((long)drvStruct + 0x38);
      }
      *plVar2 = __ptr[1];
      free(__ptr);
      if ((*(long *)((long)drvStruct + 0x38) == 0) && (*(long *)((long)drvStruct + 8) != 0)) {
        (**(code **)(*(long *)((long)drvStruct + 8) + 0x68))
                  (*(undefined8 *)((long)drvStruct + 0x20),*(undefined8 *)((long)drvStruct + 0x30),
                   *(undefined8 *)((long)drvStruct + 0x28));
      }
      UVar3 = '\0';
    }
    OSMutex_Unlock(*(OS_MUTEX **)((long)drvStruct + 0x40));
  }
  return UVar3;
}

Assistant:

UINT8 AudioDrv_DataForward_Remove(void* drvStruct, const void* destDrvStruct)
{
	ADRV_INSTANCE* audInstSrc = (ADRV_INSTANCE*)drvStruct;
	ADRV_INSTANCE* audInstDst = (ADRV_INSTANCE*)destDrvStruct;
	UINT8 retVal;
	
	if (audInstDst == NULL)
		return 0xFF;
	OSMutex_Lock(audInstSrc->hMutex);
	retVal = ADrvLst_Remove(&audInstSrc->forwardDrvs, audInstDst);
	if (retVal)
	{
		OSMutex_Unlock(audInstSrc->hMutex);
		return retVal;
	}
	
	// make it call the original callback function
	if (audInstSrc->forwardDrvs == NULL && audInstSrc->drvStruct != NULL)
		audInstSrc->drvStruct->SetCallback(audInstSrc->drvData, audInstSrc->mainCallback, audInstSrc->userParam);
	OSMutex_Unlock(audInstSrc->hMutex);
	return AERR_OK;
}